

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_mrihtol.c
# Opt level: O2

SUNAdaptController
SUNAdaptController_MRIHTol
          (SUNAdaptController HControl,SUNAdaptController TolControl,SUNContext_conflict sunctx)

{
  SUNAdaptController_Ops p_Var1;
  SUNAdaptController p_Var2;
  undefined8 *puVar3;
  
  p_Var2 = (SUNAdaptController)SUNAdaptController_NewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->gettype = SUNAdaptController_GetType_MRIHTol;
  p_Var1->estimatesteptol = SUNAdaptController_EstimateStepTol_MRIHTol;
  p_Var1->reset = SUNAdaptController_Reset_MRIHTol;
  p_Var1->setdefaults = SUNAdaptController_SetDefaults_MRIHTol;
  p_Var1->write = SUNAdaptController_Write_MRIHTol;
  p_Var1->seterrorbias = SUNAdaptController_SetErrorBias_MRIHTol;
  p_Var1->updatemrihtol = SUNAdaptController_UpdateMRIHTol_MRIHTol;
  p_Var1->space = SUNAdaptController_Space_MRIHTol;
  puVar3 = (undefined8 *)malloc(0x28);
  *puVar3 = HControl;
  puVar3[1] = TolControl;
  puVar3[2] = 0x4034000000000000;
  puVar3[3] = 0x3ee4f8b588e368f1;
  puVar3[4] = 0x3ff0000000000000;
  p_Var2->content = puVar3;
  return p_Var2;
}

Assistant:

SUNAdaptController SUNAdaptController_MRIHTol(SUNAdaptController HControl,
                                              SUNAdaptController TolControl,
                                              SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C;
  SUNAdaptControllerContent_MRIHTol content;

  /* Verify that input controllers have the appropriate type */
  SUNAssertNull(SUNAdaptController_GetType(HControl) == SUN_ADAPTCONTROLLER_H,
                SUN_ERR_ARG_INCOMPATIBLE);
  SUNAssertNull(SUNAdaptController_GetType(TolControl) == SUN_ADAPTCONTROLLER_H,
                SUN_ERR_ARG_INCOMPATIBLE);

  /* Create an empty controller object */
  C = NULL;
  C = SUNAdaptController_NewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  C->ops->gettype         = SUNAdaptController_GetType_MRIHTol;
  C->ops->estimatesteptol = SUNAdaptController_EstimateStepTol_MRIHTol;
  C->ops->reset           = SUNAdaptController_Reset_MRIHTol;
  C->ops->setdefaults     = SUNAdaptController_SetDefaults_MRIHTol;
  C->ops->write           = SUNAdaptController_Write_MRIHTol;
  C->ops->seterrorbias    = SUNAdaptController_SetErrorBias_MRIHTol;
  C->ops->updatemrihtol   = SUNAdaptController_UpdateMRIHTol_MRIHTol;
  C->ops->space           = SUNAdaptController_Space_MRIHTol;

  /* Create content */
  content = NULL;
  content = (SUNAdaptControllerContent_MRIHTol)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach input controllers */
  content->HControl   = HControl;
  content->TolControl = TolControl;

  /* Set parameters to default values */
  content->inner_max_relch  = INNER_MAX_RELCH;
  content->inner_min_tolfac = INNER_MIN_TOLFAC;
  content->inner_max_tolfac = INNER_MAX_TOLFAC;

  /* Attach content */
  C->content = content;

  return C;
}